

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O3

void Handler_soundclass_S_PlayerPawn
               (APlayerPawn *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  PClass *pPVar1;
  PClass *pPVar2;
  bool bVar3;
  FString tmp;
  FString FStack_18;
  
  FString::FString(&FStack_18,params[1].s);
  FString::ReplaceChars(&FStack_18,' ','_');
  pPVar1 = PClassPlayerPawn::RegistrationInfo.MyClass;
  pPVar2 = *(PClass **)
            ((long)&(info->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                    super_PCompoundType.super_PType.super_PTypeBase + 8);
  if (pPVar2 == (PClass *)0x0) {
    pPVar2 = (PClass *)
             (*(code *)**(undefined8 **)
                         &(info->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                          super_PCompoundType.super_PType.super_PTypeBase)(info);
    *(PClass **)
     ((long)&(info->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
             super_PCompoundType.super_PType.super_PTypeBase + 8) = pPVar2;
  }
  bVar3 = pPVar2 != (PClass *)0x0;
  if (pPVar2 != pPVar1 && bVar3) {
    do {
      pPVar2 = pPVar2->ParentClass;
      bVar3 = pPVar2 != (PClass *)0x0;
      if (pPVar2 == pPVar1) break;
    } while (pPVar2 != (PClass *)0x0);
  }
  if (bVar3) {
    FString::operator=((FString *)
                       ((long)&info[1].super_PClass.super_PNativeStruct.super_PStruct.
                               super_PNamedType.super_PCompoundType.super_PType.super_PTypeBase + 8)
                       ,&FStack_18);
    FString::~FString(&FStack_18);
    return;
  }
  __assert_fail("info->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_properties.cpp"
                ,0x9c4,
                "void Handler_soundclass_S_PlayerPawn(APlayerPawn *, PClassActor *, Baggage &, FPropParam *)"
               );
}

Assistant:

DEFINE_CLASS_PROPERTY_PREFIX(player, soundclass, S, PlayerPawn)
{
	PROP_STRING_PARM(str, 0);

	FString tmp = str;
	tmp.ReplaceChars (' ', '_');
	assert(info->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn)));
	static_cast<PClassPlayerPawn *>(info)->SoundClass = tmp;
}